

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGridWrapC.cpp
# Opt level: O0

void tsgMakeGlobalGrid(void *grid,int dimensions,int outputs,int depth,char *sType,char *sRule,
                      int *anisotropic_weights,double alpha,double beta,char *custom_filename,
                      int *limit_levels)

{
  double __s;
  TypeDepth TVar1;
  TypeOneDRule TVar2;
  ostream *poVar3;
  allocator<char> local_a1;
  string local_a0;
  TypeOneDRule local_80;
  TypeOneDRule rule;
  allocator<char> local_69;
  string local_68;
  TypeDepth local_44;
  double dStack_40;
  TypeDepth depth_type;
  double beta_local;
  double alpha_local;
  char *sRule_local;
  char *sType_local;
  int local_18;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  void *grid_local;
  
  dStack_40 = beta;
  beta_local = alpha;
  alpha_local = (double)sRule;
  sRule_local = sType;
  sType_local._4_4_ = depth;
  local_18 = outputs;
  depth_local = dimensions;
  _outputs_local = (TasmanianSparseGrid *)grid;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,sType,&local_69);
  TVar1 = TasGrid::IO::getDepthTypeString(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  __s = alpha_local;
  local_44 = TVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,(char *)__s,&local_a1);
  TVar2 = TasGrid::IO::getRuleString(&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  local_80 = TVar2;
  if (local_44 == type_none) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect depth type: ");
    poVar3 = std::operator<<(poVar3,sRule_local);
    poVar3 = std::operator<<(poVar3,", defaulting to type_iptotal.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  if (local_80 == rule_none) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"WARNING: incorrect rule type: ");
    poVar3 = std::operator<<(poVar3,sRule_local);
    poVar3 = std::operator<<(poVar3,", defaulting to clenshaw-curtis.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  TasGrid::TasmanianSparseGrid::makeGlobalGrid
            (_outputs_local,depth_local,local_18,sType_local._4_4_,local_44,local_80,
             anisotropic_weights,beta_local,dStack_40,custom_filename,limit_levels);
  return;
}

Assistant:

void tsgMakeGlobalGrid(void *grid, int dimensions, int outputs, int depth, const char * sType, const char *sRule, const int *anisotropic_weights, double alpha, double beta, const char* custom_filename, const int *limit_levels){
    TypeDepth depth_type = IO::getDepthTypeString(sType);
    TypeOneDRule rule = IO::getRuleString(sRule);
    #ifndef NDEBUG
    if (depth_type == type_none){ cerr << "WARNING: incorrect depth type: " << sType << ", defaulting to type_iptotal." << endl; }
    if (rule == rule_none){ cerr << "WARNING: incorrect rule type: " << sType << ", defaulting to clenshaw-curtis." << endl; }
    #endif // NDEBUG
    ((TasmanianSparseGrid*) grid)->makeGlobalGrid(dimensions, outputs, depth, depth_type, rule, anisotropic_weights, alpha, beta, custom_filename, limit_levels);
}